

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name-tree.c
# Opt level: O1

nametree_entry_t * nametree_find_or_insert_try(ndn_nametree_t *nametree,uint8_t *name,size_t len)

{
  uint8_t *__s1;
  ushort uVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  nametree_entry_t *pnVar7;
  ulong uVar8;
  size_t __n;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  
  if (len < 2) {
LAB_001149bc:
    pnVar7 = (nametree_entry_t *)0x0;
  }
  else {
    uVar6 = (ulong)(0xfc < name[1]) * 2 + 2;
    uVar8 = 0;
    if (uVar6 < len) {
      uVar8 = 0;
      do {
        __s1 = name + uVar6;
        uVar3 = (ulong)name[uVar6 + 1] + 2;
        __n = 0x24;
        if (uVar3 < 0x24) {
          __n = uVar3;
        }
        lVar4 = uVar8 * 0x2e;
        uVar10 = (ulong)*(ushort *)(nametree + lVar4 + 0x26);
        if (*(ushort *)(nametree + lVar4 + 0x26) == 0xffff) {
          bVar11 = false;
          uVar9 = 0xffff;
          uVar8 = 0xffff;
        }
        else {
          iVar2 = memcmp(__s1,nametree + uVar10 * 0x2e,__n);
          if (iVar2 < 1) {
            uVar9 = 0xffff;
            uVar8 = uVar10;
          }
          else {
            do {
              uVar9 = uVar10;
              uVar8 = (ulong)*(ushort *)(nametree + uVar9 * 0x2e + 0x28);
              if (*(ushort *)(nametree + uVar9 * 0x2e + 0x28) == 0xffff) {
                iVar2 = 1;
                break;
              }
              iVar2 = memcmp(__s1,nametree + uVar8 * 0x2e,__n);
              uVar10 = uVar8;
            } while (0 < iVar2);
          }
          bVar11 = iVar2 == 0;
          uVar10 = uVar8;
        }
        if (!bVar11) {
          uVar1 = *(ushort *)(nametree + 0x28);
          if (uVar1 == 0xffff) {
            uVar8 = 0xffff;
          }
          else {
            lVar5 = (ulong)(uint)uVar1 * 0x2e;
            *(undefined2 *)(nametree + 0x28) = *(undefined2 *)(nametree + lVar5 + 0x28);
            *(undefined8 *)(nametree + lVar5 + 0x26) = 0xffffffffffffffff;
            memcpy(nametree + lVar5,__s1,__n);
            uVar8 = (ulong)uVar1;
          }
          if ((int)uVar8 == 0xffff) goto LAB_001149bc;
          lVar5 = uVar9 * 0x2e + 0x28;
          if ((int)uVar9 == 0xffff) {
            lVar5 = lVar4 + 0x26;
          }
          *(short *)(nametree + lVar5) = (short)uVar8;
          *(short *)(nametree + uVar8 * 0x2e + 0x28) = (short)uVar10;
        }
        uVar6 = uVar6 + uVar3;
      } while (uVar6 < len);
    }
    pnVar7 = (nametree_entry_t *)(nametree + uVar8 * 0x2e);
  }
  return pnVar7;
}

Assistant:

static nametree_entry_t*
nametree_find_or_insert_try(ndn_nametree_t *nametree, uint8_t name[], size_t len)
{
  int now_node, last_node, father = 0 , tmp , new_node_number;
  size_t component_len, eqiv_component_len, offset = 0;
  // TODO: Put it into decoder
  if (len < 2) return NULL;
  if (name[1] < 253) offset = 2; else offset = 4;
  while (offset < len) {
    component_len = name[offset + 1] + 2;
    eqiv_component_len = minof2(component_len, NDN_NAME_COMPONENT_BUFFER_SIZE);
    now_node = (*nametree)[father].left_child;
    last_node = NDN_INVALID_ID;
    tmp = -2;
    while (now_node != NDN_INVALID_ID) {
      tmp = memcmp(name+offset, (*nametree)[now_node].val , eqiv_component_len);
      if (tmp <= 0) break;
      last_node = now_node;
      now_node = (*nametree)[now_node].right_bro;
    }
    if (tmp != 0) {
      new_node_number = nametree_create_node(nametree, name + offset , eqiv_component_len);
      if (new_node_number == NDN_INVALID_ID) return NULL;
      if(last_node == NDN_INVALID_ID){
        (*nametree)[father].left_child = new_node_number;
      }else{
        (*nametree)[last_node].right_bro = new_node_number;
      }
      (*nametree)[new_node_number].right_bro = now_node;
      now_node = new_node_number;
    }
    offset += component_len;
    father = now_node;
  }
  return &(*nametree)[father];
}